

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool SparseKeyTest<72,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  Blob<72> local_58;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_48;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x48,pcVar2,(ulong)(uint)setbits);
  local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.bytes[0] = '\0';
  local_58.bytes[1] = '\0';
  local_58.bytes[2] = '\0';
  local_58.bytes[3] = '\0';
  local_58.bytes[4] = '\0';
  local_58.bytes[5] = '\0';
  local_58.bytes[6] = '\0';
  local_58.bytes[7] = '\0';
  local_58.bytes[8] = '\0';
  local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (iVar3 != 0) {
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::resize(&local_48,1);
    (*hash.m_hash)(&local_58,9,0,
                   local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                   super__Vector_impl_data._M_start);
  }
  SparseKeygenRecurse<Blob<72>,Blob<160>>(hash.m_hash,0,setbits,inclusive,&local_58,&local_48);
  printf("%d keys\n",
         (ulong)(uint)((int)((ulong)((long)local_48.
                                           super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_48.
                                          super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x33333333));
  bVar1 = TestHashList<Blob<160>>(&local_48,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}